

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

string * __thiscall
Parser::bracketOperatorFix(string *__return_storage_ptr__,Parser *this,string *data)

{
  char cVar1;
  Instruction IVar2;
  int iVar3;
  mapped_type *pmVar4;
  string *psVar5;
  char cVar6;
  bool bVar7;
  ulong uVar8;
  uint currentLayer;
  string newOperator;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bracketOperators;
  key_type local_8c;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  uVar8 = 0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_8c = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (data->_M_string_length != 0) {
    bVar7 = false;
    do {
      cVar1 = (data->_M_dataplus)._M_p[uVar8];
      bVar7 = (bool)(cVar1 == '\"' ^ bVar7);
      cVar6 = (char)__return_storage_ptr__;
      if (bVar7) {
LAB_0010d872:
        std::__cxx11::string::push_back(cVar6);
      }
      else if ((cVar1 == ',') || (cVar1 == ')')) {
        pmVar4 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_60,&local_8c);
        if (pmVar4->_M_string_length != 0) {
          std::__cxx11::string::push_back(cVar6);
          pmVar4 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_8c);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(pmVar4->_M_dataplus)._M_p);
        }
        std::__cxx11::string::push_back(cVar6);
        if ((data->_M_dataplus)._M_p[uVar8] == ')') {
          local_8c = local_8c - 1;
        }
        else {
          pmVar4 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_8c);
          pmVar4->_M_string_length = 0;
          *(pmVar4->_M_dataplus)._M_p = '\0';
        }
      }
      else {
        if (cVar1 == '(') {
          local_8c = local_8c + 1;
          pmVar4 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_8c);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x1107a9);
          goto LAB_0010d872;
        }
        std::__cxx11::string::substr((ulong)&local_88,(ulong)data);
        IVar2 = stringToInstruction(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if (IVar2 == NONE) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)data);
          IVar2 = stringToInstruction(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if (IVar2 == NONE) goto LAB_0010d872;
          std::__cxx11::string::substr((ulong)&local_88,(ulong)data);
          pmVar4 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_8c);
          if ((pmVar4->_M_string_length != 0) &&
             ((pmVar4 = std::
                        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_60,&local_8c),
              local_88._M_string_length != pmVar4->_M_string_length ||
              ((local_88._M_string_length != 0 &&
               (iVar3 = bcmp(local_88._M_dataplus._M_p,(pmVar4->_M_dataplus)._M_p,
                             local_88._M_string_length), iVar3 != 0)))))) {
            psVar5 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar5 = psVar5 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      (psVar5,"Please only use one operator per bracket at the moment","");
            __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          pmVar4 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_8c);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::erase
                    ((ulong)__return_storage_ptr__,
                     __return_storage_ptr__->_M_string_length - local_88._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)data);
          pmVar4 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_8c);
          std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          std::__cxx11::string::erase
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
          uVar8 = (ulong)((int)uVar8 + 1);
        }
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < data->_M_string_length);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::bracketOperatorFix(const std::string &data)
{
    //Convert things like "((1 + 2) + (3 * 4))" to "((1 2 +) (3 4 *) +)"

    std::string returnValue; //Store what the function will return as it's generated
    unsigned int currentLayer = 0; //To keep track of the current bracket layer
    std::map<unsigned int, std::string> bracketOperators; //Keep track of each bracket layer's operator. Map to keep track of multiple layers of brackets. map<LAYER, OPERATOR>
    bool isQuoteOpen = false;

    //Find operators and data
    for(unsigned int a = 0; a < data.size(); a++)
    {
        //If quotation marks
        if(data[a] == '"')
        {
            isQuoteOpen = !isQuoteOpen;
        }

        //If new bracket, update bracket layer and set the layer's default operator (+)
        if(!isQuoteOpen && data[a] == '(')
        {
            currentLayer++;
            bracketOperators[currentLayer] = "";
            returnValue += data[a];
        }

        //If we're exiting a bracket, update the layer and insert a space followed by this layer's operator
        else if(!isQuoteOpen && (data[a] == ')' || data[a] == ','))
        {
            if(!bracketOperators[currentLayer].empty()) //Only add operator to the end if there is one
            {
                returnValue += ' ';
                returnValue += bracketOperators[currentLayer];
            }
            returnValue += data[a];
            if(data[a] == ')')
                currentLayer--;
            else
                bracketOperators[currentLayer].clear();
        }

        //Else if dual-character operator. Temporary fix.
        else if(!isQuoteOpen && a != data.size() && stringToInstruction(data.substr(a, 2)) != Instruction::NONE)
        {
            bracketOperators[currentLayer] = data.substr(a, 2);
            returnValue.erase(returnValue.size()-1, 1);
            a++;
        }

        //Else if a single-character operator, don't add the operator to the return value and store this layer's operator
        else if(!isQuoteOpen && stringToInstruction(data.substr(a, 1)) != Instruction::NONE)
        {
            std::string newOperator = data.substr(a, 1);
            if(!bracketOperators[currentLayer].empty() && newOperator != bracketOperators[currentLayer])
            {
                throw std::string("Please only use one operator per bracket at the moment");
            }

            bracketOperators[currentLayer] = newOperator;
            returnValue.erase(returnValue.size()-newOperator.size(), newOperator.size());
        }

        //Else, store current character. Not important.
        else
        {
            returnValue += data[a];
        }
    }
    return returnValue;
}